

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall
TestStreamWriterTestdropNullPlaceholders::runTestCase
          (TestStreamWriterTestdropNullPlaceholders *this)

{
  bool bVar1;
  byte bVar2;
  Value *this_00;
  StreamWriterBuilder *this_01;
  char *in_RDI;
  Value *in_stack_00000080;
  Factory *in_stack_00000088;
  Value nullValue;
  StreamWriterBuilder b;
  undefined7 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffedf;
  Value *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  ValueType in_stack_fffffffffffffeec;
  uint uVar3;
  StreamWriterBuilder *in_stack_fffffffffffffef0;
  uint line;
  TestResult *in_stack_ffffffffffffff00;
  Value *in_stack_ffffffffffffff10;
  string local_b8 [184];
  
  Json::StreamWriterBuilder::StreamWriterBuilder(in_stack_fffffffffffffef0);
  Json::Value::Value((Value *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
  Json::Value::Value(in_stack_fffffffffffffee0,(bool)in_stack_fffffffffffffedf);
  this_00 = Json::Value::operator[]
                      ((Value *)in_stack_fffffffffffffef0,
                       (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  Json::Value::operator=
            (in_stack_fffffffffffffee0,
             (Value *)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
  Json::Value::~Value(in_stack_ffffffffffffff10);
  Json::writeString_abi_cxx11_(in_stack_00000088,in_stack_00000080);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffee0,
                          (char *)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
  uVar3 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffeec);
  std::__cxx11::string::~string(local_b8);
  if ((uVar3 & 0x1000000) == 0) {
    JsonTest::TestResult::addFailure
              (in_stack_ffffffffffffff00,in_RDI,(uint)((ulong)this_00 >> 0x20),
               (char *)CONCAT44(uVar3,in_stack_fffffffffffffee8));
  }
  Json::Value::Value(in_stack_fffffffffffffee0,(bool)in_stack_fffffffffffffedf);
  this_01 = (StreamWriterBuilder *)
            Json::Value::operator[](this_00,(char *)CONCAT44(uVar3,in_stack_fffffffffffffee8));
  line = (uint)((ulong)this_00 >> 0x20);
  Json::Value::operator=
            ((Value *)this_01,(Value *)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8)
            );
  Json::Value::~Value(in_stack_ffffffffffffff10);
  Json::writeString_abi_cxx11_(in_stack_00000088,in_stack_00000080);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          this_01,(char *)CONCAT17(in_stack_fffffffffffffedf,
                                                   in_stack_fffffffffffffed8));
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff00);
  if ((bVar2 & 1) == 0) {
    JsonTest::TestResult::addFailure
              (in_stack_ffffffffffffff00,in_RDI,line,
               (char *)CONCAT44(uVar3,in_stack_fffffffffffffee8));
  }
  Json::Value::~Value(in_stack_ffffffffffffff10);
  Json::StreamWriterBuilder::~StreamWriterBuilder(this_01);
  return;
}

Assistant:

JSONTEST_FIXTURE(StreamWriterTest, dropNullPlaceholders) {
  Json::StreamWriterBuilder b;
  Json::Value nullValue;
  b.settings_["dropNullPlaceholders"] = false;
  JSONTEST_ASSERT(Json::writeString(b, nullValue) == "null");
  b.settings_["dropNullPlaceholders"] = true;
  JSONTEST_ASSERT(Json::writeString(b, nullValue) == "");
}